

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O2

bool __thiscall QHttpSocketEngine::readHttpHeader(QHttpSocketEngine *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  qint64 qVar4;
  qsizetype qVar5;
  ReplyState RVar6;
  long *plVar7;
  QHttpNetworkReplyPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  bool contentLengthOk;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (*(int *)(lVar1 + 0x108) == 5) {
    plVar7 = *(long **)(lVar1 + 0x100);
    this_00 = (QHttpNetworkReplyPrivate *)plVar7[1];
    RVar6 = this_00->state;
    if (RVar6 == ReadingStatusState) {
LAB_0020c355:
      qVar4 = QHttpNetworkReplyPrivate::readStatus(this_00,*(QIODevice **)(lVar1 + 0xf8));
      if (qVar4 == -1) goto LAB_0020c445;
      plVar7 = *(long **)(lVar1 + 0x100);
      this_00 = (QHttpNetworkReplyPrivate *)plVar7[1];
      RVar6 = this_00->state;
      bVar2 = true;
      if (RVar6 == ReadingStatusState) goto LAB_0020c447;
    }
    else if (RVar6 == NothingDoneState) {
      QHttpNetworkReplyPrivate::clearHttpLayerInformation(this_00);
      this_00 = *(QHttpNetworkReplyPrivate **)(*(long *)(lVar1 + 0x100) + 8);
      this_00->state = ReadingStatusState;
      goto LAB_0020c355;
    }
    if (RVar6 == ReadingHeaderState) {
      qVar4 = QHttpNetworkReplyPrivate::readHeader(this_00,*(QIODevice **)(lVar1 + 0xf8));
      if (qVar4 == -1) goto LAB_0020c445;
      plVar7 = *(long **)(lVar1 + 0x100);
      bVar2 = true;
      if (*(int *)(plVar7[1] + 0xd0) == 2) goto LAB_0020c447;
    }
    contentLengthOk = true;
    qVar5 = QByteArrayView::lengthHelperCharArray("Content-Length",0xf);
    local_78.d = (Data *)0x0;
    local_78.ptr = (char *)0x0;
    local_78.size = 0;
    (**(code **)(*plVar7 + 0x98))(&local_58,plVar7,qVar5,"Content-Length",&local_78);
    iVar3 = QByteArray::toInt((bool *)&local_58,(int)&contentLengthOk);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
    if ((0 < iVar3) && (contentLengthOk != false)) {
      *(int *)(lVar1 + 0x120) = iVar3;
    }
    *(undefined4 *)(lVar1 + 0x108) = 4;
    bVar2 = true;
  }
  else {
LAB_0020c445:
    bVar2 = false;
  }
LAB_0020c447:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpSocketEngine::readHttpHeader()
{
    Q_D(QHttpSocketEngine);

    if (d->state != ReadResponseHeader)
        return false;

    bool ok = true;
    if (d->reply->d_func()->state == QHttpNetworkReplyPrivate::NothingDoneState) {
        // do not keep old content sizes, status etc. around
        d->reply->d_func()->clearHttpLayerInformation();
        d->reply->d_func()->state = QHttpNetworkReplyPrivate::ReadingStatusState;
    }
    if (d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingStatusState) {
        ok = d->reply->d_func()->readStatus(d->socket) != -1;
        if (ok && d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingStatusState)
            return true; //Not done parsing headers yet, wait for more data
    }
    if (ok && d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingHeaderState) {
        ok = d->reply->d_func()->readHeader(d->socket) != -1;
        if (ok && d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingHeaderState)
            return true; //Not done parsing headers yet, wait for more data
    }
    if (ok) {
        bool contentLengthOk;
        int contentLength = d->reply->headerField("Content-Length").toInt(&contentLengthOk);
        if (contentLengthOk && contentLength > 0)
            d->pendingResponseData = contentLength;
        d->state = ReadResponseContent; // we are done reading the header
    }
    return ok;
}